

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_visit.c
# Opt level: O2

int emit_object(json_object *jso,int flags,json_object *parent_jso,char *jso_key,size_t *jso_index,
               void *userarg)

{
  undefined8 uVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (jso_index == (size_t *)0x0) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    sVar2 = *jso_index;
  }
  pcVar3 = "(null)";
  if (jso_key != (char *)0x0) {
    pcVar3 = jso_key;
  }
  uVar1 = json_object_to_json_string();
  printf("flags: 0x%x, key: %s, index: %ld, value: %s\n",flags,pcVar3,sVar2,uVar1);
  return 0;
}

Assistant:

static int emit_object(json_object *jso, int flags, json_object *parent_jso, const char *jso_key,
                       size_t *jso_index, void *userarg)
{
	printf("flags: 0x%x, key: %s, index: %ld, value: %s\n", flags,
	       (jso_key ? jso_key : "(null)"), (jso_index ? (long)*jso_index : -1L),
	       json_object_to_json_string(jso));
	return JSON_C_VISIT_RETURN_CONTINUE;
}